

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::Internals::InitializeDefinitions(Internals *this,cmMakefile *parent)

{
  reference this_00;
  undefined1 local_70 [8];
  StackConstIter local_68;
  undefined1 local_60 [8];
  StackConstIter local_58;
  cmDefinitions local_50;
  cmMakefile *local_18;
  cmMakefile *parent_local;
  Internals *this_local;
  
  local_18 = parent;
  parent_local = (cmMakefile *)this;
  cmsys::auto_ptr<cmMakefile::Internals>::operator->(&parent->Internal);
  std::__cxx11::list<cmDefinitions,_std::allocator<cmDefinitions>_>::rbegin
            ((list<cmDefinitions,_std::allocator<cmDefinitions>_> *)local_60);
  std::reverse_iterator<std::_List_const_iterator<cmDefinitions>>::
  reverse_iterator<std::_List_iterator<cmDefinitions>>
            ((reverse_iterator<std::_List_const_iterator<cmDefinitions>> *)&local_58,
             (reverse_iterator<std::_List_iterator<cmDefinitions>_> *)local_60);
  cmsys::auto_ptr<cmMakefile::Internals>::operator->(&local_18->Internal);
  std::__cxx11::list<cmDefinitions,_std::allocator<cmDefinitions>_>::rend
            ((list<cmDefinitions,_std::allocator<cmDefinitions>_> *)local_70);
  std::reverse_iterator<std::_List_const_iterator<cmDefinitions>>::
  reverse_iterator<std::_List_iterator<cmDefinitions>>
            ((reverse_iterator<std::_List_const_iterator<cmDefinitions>> *)&local_68,
             (reverse_iterator<std::_List_iterator<cmDefinitions>_> *)local_70);
  cmDefinitions::MakeClosure(&local_50,&local_58,&local_68);
  this_00 = std::__cxx11::list<cmDefinitions,_std::allocator<cmDefinitions>_>::back(&this->VarStack)
  ;
  cmDefinitions::operator=(this_00,&local_50);
  cmDefinitions::~cmDefinitions(&local_50);
  return;
}

Assistant:

void InitializeDefinitions(cmMakefile* parent)
  {
    this->VarStack.back() =
        cmDefinitions::MakeClosure(parent->Internal->VarStack.rbegin(),
                                   parent->Internal->VarStack.rend());
  }